

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

void Amap_ManCleanData(Amap_Man_t *p)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    lVar1 = 0;
    do {
      if (pVVar2->pArray[lVar1] != (void *)0x0) {
        *(undefined8 *)((long)pVVar2->pArray[lVar1] + 0x28) = 0;
      }
      lVar1 = lVar1 + 1;
      pVVar2 = p->vObjs;
    } while (lVar1 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Amap_ManCleanData( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i;
//    Amap_ManForEachNode( p, pObj, i )
//        ABC_FREE( pObj->pData );
    Amap_ManForEachObj( p, pObj, i )
        pObj->pData = NULL;
}